

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::blocktype<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long *puVar3;
  size_t sVar4;
  Err *pEVar5;
  Ok *u;
  Err local_200;
  Err *local_1e0;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  undefined1 local_1a8 [8];
  Result<wasm::Ok> type;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Result<wasm::Ok> use;
  Err local_100;
  Err *local_e0;
  Err *err;
  MaybeResult<unsigned_long> _val;
  undefined1 local_a0 [8];
  MaybeResult<unsigned_long> res;
  Lexer initialLexer;
  size_t pos;
  ParseDeclsCtx *ctx_local;
  
  sVar2 = Lexer::getPos(&ctx->in);
  Lexer::Lexer((Lexer *)((long)&res.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20)
               ,&ctx->in);
  results<wasm::WATParser::ParseDeclsCtx>((MaybeResult<unsigned_long> *)local_a0,ctx);
  bVar1 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_a0);
  if (bVar1) {
    MaybeResult<unsigned_long>::MaybeResult
              ((MaybeResult<unsigned_long> *)&err,(MaybeResult<unsigned_long> *)local_a0);
    local_e0 = MaybeResult<unsigned_long>::getErr((MaybeResult<unsigned_long> *)&err);
    use.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _36_1_ = local_e0 != (Err *)0x0;
    if ((bool)use.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
      wasm::Err::Err(&local_100,local_e0);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_100);
      wasm::Err::~Err(&local_100);
    }
    use.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _37_3_ = 0;
    MaybeResult<unsigned_long>::~MaybeResult((MaybeResult<unsigned_long> *)&err);
    if (use.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ != 0) goto LAB_02385bbb;
    puVar3 = MaybeResult<unsigned_long>::operator*((MaybeResult<unsigned_long> *)local_a0);
    sVar4 = NullTypeParserCtx::getResultsSize((NullTypeParserCtx *)ctx,*puVar3);
    if (sVar4 == 1) {
      puVar3 = MaybeResult<unsigned_long>::operator*((MaybeResult<unsigned_long> *)local_a0);
      NullTypeParserCtx::getBlockTypeFromResult((NullTypeParserCtx *)ctx,*puVar3);
      Result<wasm::Ok>::Result<wasm::Ok>
                (__return_storage_ptr__,
                 (Ok *)((long)&use.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x23));
      use.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
      .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
      _36_4_ = 1;
      goto LAB_02385bbb;
    }
  }
  use.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_4_ = 0;
LAB_02385bbb:
  MaybeResult<unsigned_long>::~MaybeResult((MaybeResult<unsigned_long> *)local_a0);
  if (use.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
      .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
      _36_4_ == 0) {
    Lexer::operator=(&ctx->in,(Lexer *)((long)&res.val.
                                               super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>
                                               .
                                               super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>
                                       + 0x20));
    typeuse<wasm::WATParser::ParseDeclsCtx>
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx,false);
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)&err_1,
               (Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    pEVar5 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
    if (pEVar5 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar5);
      Result<wasm::Ok>::Result
                (__return_storage_ptr__,
                 (Err *)((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    use.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _37_3_ = 0;
    use.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
    _36_1_ = pEVar5 != (Err *)0x0;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
    if (use.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
      Result<wasm::Ok>::operator*
                ((Result<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      NullTypeParserCtx::getBlockTypeFromTypeUse
                (local_1a8,(NullTypeParserCtx *)ctx,sVar2 & 0xffffffff);
      Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_2,(Result<wasm::Ok> *)local_1a8);
      local_1e0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
      bVar1 = local_1e0 != (Err *)0x0;
      if (bVar1) {
        wasm::Err::Err(&local_200,local_1e0);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_200);
        wasm::Err::~Err(&local_200);
      }
      use.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
      .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
      _37_3_ = 0;
      use.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>
      .super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
      _36_1_ = bVar1;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
      if (use.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
        u = Result<wasm::Ok>::operator*((Result<wasm::Ok> *)local_1a8);
        Result<wasm::Ok>::Result<wasm::Ok&>(__return_storage_ptr__,u);
        use.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_1a8);
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  Lexer::~Lexer((Lexer *)((long)&res.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20
                         ));
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::BlockTypeT> blocktype(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  auto initialLexer = ctx.in;

  if (auto res = results(ctx)) {
    CHECK_ERR(res);
    if (ctx.getResultsSize(*res) == 1) {
      return ctx.getBlockTypeFromResult(*res);
    }
  }

  // We either had no results or multiple results. Reset and parse again as a
  // type use.
  ctx.in = initialLexer;
  auto use = typeuse(ctx, false);
  CHECK_ERR(use);

  auto type = ctx.getBlockTypeFromTypeUse(pos, *use);
  CHECK_ERR(type);
  return *type;
}